

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_tuple_primitive_size
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  ulong uVar1;
  sysbvm_tuple_t sVar2;
  
  if (argumentCount != 1) {
    sysbvm_error_argumentCountMismatch(1,argumentCount);
  }
  uVar1 = *arguments;
  sVar2 = 0xb;
  if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
    sVar2 = (ulong)(*(uint *)(uVar1 + 0xc) >> 3) << 4 | 0xb;
  }
  return sVar2;
}

Assistant:

static sysbvm_tuple_t sysbvm_tuple_primitive_size(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 1) sysbvm_error_argumentCountMismatch(1, argumentCount);

    return sysbvm_tuple_size_encode(context, sysbvm_tuple_getSizeInSlots(arguments[0]));
}